

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O0

Direction __thiscall
spvtools::opt::LoopPeelingPass::LoopPeelingInfo::HandleInequality
          (LoopPeelingInfo *this,CmpOperator cmp_op,SExpression lhs,SERecurrentNode *rhs)

{
  SExpression lhs_00;
  SExpression rhs_00;
  SExpression lhs_01;
  SExpression rhs_wrapper;
  SExpression rhs_01;
  ulong uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  SENode *pSVar5;
  undefined4 extraout_var;
  Direction DVar6;
  undefined4 extraout_var_00;
  int64_t iVar7;
  uint local_100;
  PeelDirection local_fc [2];
  uint local_f4;
  undefined1 auStack_f0 [4];
  uint32_t cast_iteration;
  SENode *local_e0;
  ScalarEvolutionAnalysis *local_d8;
  ScalarEvolutionAnalysis *local_d0;
  LoopPeelingInfo *local_c0;
  SENode *local_b8;
  bool local_aa;
  bool local_a9;
  bool current_iteration;
  ulong uStack_a8;
  bool first_iteration;
  int64_t iteration;
  SENode *local_98;
  ScalarEvolutionAnalysis *local_90;
  SExpression local_80;
  undefined1 local_70 [8];
  pair<spvtools::opt::SExpression,_long> flip_iteration;
  SExpression coefficient;
  SExpression offset;
  SERecurrentNode *rhs_local;
  CmpOperator cmp_op_local;
  LoopPeelingInfo *this_local;
  SExpression lhs_local;
  
  lhs_local.node_ = (SENode *)lhs.scev_;
  this_local = (LoopPeelingInfo *)lhs.node_;
  pSVar5 = SERecurrentNode::GetOffset(rhs);
  SExpression::SExpression((SExpression *)&coefficient.scev_,pSVar5);
  pSVar5 = SERecurrentNode::GetCoefficient(rhs);
  SExpression::SExpression((SExpression *)&flip_iteration.second,pSVar5);
  local_90 = coefficient.scev_;
  rhs_01.scev_ = (ScalarEvolutionAnalysis *)offset.node_;
  rhs_01.node_ = (SENode *)coefficient.scev_;
  local_80 = SExpression::operator-((SExpression *)&this_local,rhs_01);
  iteration = flip_iteration.second;
  local_98 = coefficient.node_;
  rhs_wrapper.scev_ = (ScalarEvolutionAnalysis *)coefficient.node_;
  rhs_wrapper.node_ = (SENode *)flip_iteration.second;
  SExpression::operator/((pair<spvtools::opt::SExpression,_long> *)local_70,&local_80,rhs_wrapper);
  pSVar5 = SExpression::operator->((SExpression *)local_70);
  iVar3 = (*pSVar5->_vptr_SENode[4])();
  if (CONCAT44(extraout_var,iVar3) == 0) {
    DVar6 = GetNoneDirection();
    return DVar6;
  }
  pSVar5 = SExpression::operator->((SExpression *)local_70);
  iVar3 = (*pSVar5->_vptr_SENode[4])();
  iVar7 = SEConstantNode::FoldToSingleValue((SEConstantNode *)CONCAT44(extraout_var_00,iVar3));
  uStack_a8 = iVar7 + (ulong)(flip_iteration.first.scev_ != (ScalarEvolutionAnalysis *)0x0);
  if (((long)uStack_a8 < 1) || (this->loop_max_iterations_ <= uStack_a8)) {
    DVar6 = GetNoneDirection();
    return DVar6;
  }
  if ((flip_iteration.first.scev_ == (ScalarEvolutionAnalysis *)0x0) &&
     ((cmp_op == kLE || (cmp_op == kGE)))) {
    local_c0 = this_local;
    local_b8 = lhs_local.node_;
    local_d0 = coefficient.scev_;
    lhs_01.scev_ = (ScalarEvolutionAnalysis *)lhs_local.node_;
    lhs_01.node_ = (SENode *)this_local;
    rhs_00.scev_ = (ScalarEvolutionAnalysis *)offset.node_;
    rhs_00.node_ = (SENode *)coefficient.scev_;
    bVar2 = EvalOperator(this,cmp_op,lhs_01,rhs_00,&local_a9);
    if (bVar2) {
      local_e0 = (SENode *)this_local;
      local_d8 = (ScalarEvolutionAnalysis *)lhs_local.node_;
      _auStack_f0 = GetValueAtIteration(this,rhs,uStack_a8);
      lhs_00.scev_ = local_d8;
      lhs_00.node_ = local_e0;
      bVar2 = EvalOperator(this,cmp_op,lhs_00,_auStack_f0,&local_aa);
      if (bVar2) {
        if ((local_a9 & 1U) == (local_aa & 1U)) {
          uStack_a8 = uStack_a8 + 1;
        }
        goto LAB_004045a1;
      }
    }
    lhs_local.scev_ = (ScalarEvolutionAnalysis *)GetNoneDirection();
  }
  else {
LAB_004045a1:
    uVar1 = uStack_a8;
    local_f4 = 0;
    uVar4 = std::numeric_limits<unsigned_int>::max();
    if (uVar1 < uVar4) {
      local_f4 = (uint)uStack_a8;
    }
    if (local_f4 == 0) {
      lhs_local.scev_ = (ScalarEvolutionAnalysis *)GetNoneDirection();
    }
    else if ((ulong)local_f4 < this->loop_max_iterations_ >> 1) {
      local_fc[1] = 1;
      std::pair<spvtools::opt::LoopPeelingPass::PeelDirection,_unsigned_int>::
      pair<spvtools::opt::LoopPeelingPass::PeelDirection,_unsigned_int_&,_true>
                ((pair<spvtools::opt::LoopPeelingPass::PeelDirection,_unsigned_int> *)
                 &lhs_local.scev_,local_fc + 1,&local_f4);
    }
    else {
      local_fc[0] = kAfter;
      local_100 = (int)this->loop_max_iterations_ - local_f4;
      std::pair<spvtools::opt::LoopPeelingPass::PeelDirection,_unsigned_int>::
      pair<spvtools::opt::LoopPeelingPass::PeelDirection,_unsigned_int,_true>
                ((pair<spvtools::opt::LoopPeelingPass::PeelDirection,_unsigned_int> *)
                 &lhs_local.scev_,local_fc,&local_100);
    }
  }
  return (Direction)lhs_local.scev_;
}

Assistant:

LoopPeelingPass::LoopPeelingInfo::Direction
LoopPeelingPass::LoopPeelingInfo::HandleInequality(CmpOperator cmp_op,
                                                   SExpression lhs,
                                                   SERecurrentNode* rhs) const {
  SExpression offset = rhs->GetOffset();
  SExpression coefficient = rhs->GetCoefficient();
  // Compute (cst - B) / A.
  std::pair<SExpression, int64_t> flip_iteration = (lhs - offset) / coefficient;
  if (!flip_iteration.first->AsSEConstantNode()) {
    return GetNoneDirection();
  }
  // note: !!flip_iteration.second normalize to 0/1 (via bool cast).
  int64_t iteration =
      flip_iteration.first->AsSEConstantNode()->FoldToSingleValue() +
      !!flip_iteration.second;
  if (iteration <= 0 ||
      loop_max_iterations_ <= static_cast<uint64_t>(iteration)) {
    // Always true or false within the loop bounds.
    return GetNoneDirection();
  }
  // If this is a <= or >= operator and the iteration, make sure |iteration| is
  // the one flipping the condition.
  // If (cst - B) and A are not divisible, this equivalent to a < or > check, so
  // we skip this test.
  if (!flip_iteration.second &&
      (cmp_op == CmpOperator::kLE || cmp_op == CmpOperator::kGE)) {
    bool first_iteration;
    bool current_iteration;
    if (!EvalOperator(cmp_op, lhs, offset, &first_iteration) ||
        !EvalOperator(cmp_op, lhs, GetValueAtIteration(rhs, iteration),
                      &current_iteration)) {
      return GetNoneDirection();
    }
    // If the condition did not flip the next will.
    if (first_iteration == current_iteration) {
      iteration++;
    }
  }

  uint32_t cast_iteration = 0;
  // Integrity check: can we fit |iteration| in a uint32_t ?
  if (static_cast<uint64_t>(iteration) < std::numeric_limits<uint32_t>::max()) {
    cast_iteration = static_cast<uint32_t>(iteration);
  }

  if (cast_iteration) {
    // Peel before if we are closer to the start, after if closer to the end.
    if (loop_max_iterations_ / 2 > cast_iteration) {
      return Direction{LoopPeelingPass::PeelDirection::kBefore, cast_iteration};
    } else {
      return Direction{
          LoopPeelingPass::PeelDirection::kAfter,
          static_cast<uint32_t>(loop_max_iterations_ - cast_iteration)};
    }
  }

  return GetNoneDirection();
}